

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

scoped_fd * __thiscall phosg::scoped_fd::operator=(scoped_fd *this,scoped_fd *other)

{
  scoped_fd *other_local;
  scoped_fd *this_local;
  
  close(this,(int)other);
  this->fd = other->fd;
  other->fd = -1;
  return this;
}

Assistant:

scoped_fd& scoped_fd::operator=(scoped_fd&& other) {
  this->close();
  this->fd = other.fd;
  other.fd = -1;
  return *this;
}